

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O1

ON_Plane * __thiscall
ON_SubDMeshFragment::CenterFrame(ON_Plane *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  byte bVar1;
  double *pdVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  ON_Plane *pOVar7;
  ON_Plane *pOVar8;
  uint P_dex;
  byte bVar9;
  double d;
  ON_3dVector N;
  ON_3dVector X;
  ON_3dVector V;
  ON_3dPoint Q;
  ON_3dPoint P;
  ON_3dVector local_d8;
  ON_3dVector local_b8;
  ON_3dVector local_a0;
  ON_3dVector local_88;
  ON_3dVector local_70;
  ON_3dPoint local_58;
  ON_3dVector local_40;
  
  bVar9 = 0;
  bVar4 = HasValidPointAndNormalGrid(this);
  if (bVar4) {
    bVar1 = (this->m_grid).m_side_segment_count;
    if (bVar1 == 1) {
      pdVar2 = this->m_P;
      sVar3 = this->m_P_stride;
      ON_3dPoint::ON_3dPoint
                (&local_58,(*pdVar2 + pdVar2[sVar3] + pdVar2[sVar3 * 2] + pdVar2[sVar3 * 3]) * 0.25,
                 (pdVar2[1] + pdVar2[sVar3 + 1] + pdVar2[sVar3 * 2 + 1] + pdVar2[sVar3 * 3 + 1]) *
                 0.25,(pdVar2[2] + pdVar2[sVar3 + 2] + pdVar2[sVar3 * 2 + 2] + pdVar2[sVar3 * 3 + 2]
                      ) * 0.25);
      if (!NAN(local_58.x)) {
        pdVar2 = this->m_N;
        sVar3 = this->m_N_stride;
        ON_3dVector::ON_3dVector
                  (&local_70,*pdVar2 + pdVar2[sVar3] + pdVar2[sVar3 * 2] + pdVar2[sVar3 * 3],
                   pdVar2[1] + pdVar2[sVar3 + 1] + pdVar2[sVar3 * 2 + 1] + pdVar2[sVar3 * 3 + 1],
                   pdVar2[2] + pdVar2[sVar3 + 2] + pdVar2[sVar3 * 2 + 2] + pdVar2[sVar3 * 3 + 2]);
        ON_3dVector::UnitVector(&local_d8,&local_70);
        bVar4 = ON_3dVector::IsUnitVector(&local_d8);
        if (!bVar4) {
          ON_3dVector::ON_3dVector(&local_88,this->m_N);
          ON_3dVector::UnitVector(&local_70,&local_88);
          local_d8.z = local_70.z;
          local_d8.x = local_70.x;
          local_d8.y = local_70.y;
        }
        bVar4 = ON_3dVector::IsUnitVector(&local_d8);
        if (bVar4) {
          ON_Plane::ON_Plane(__return_storage_ptr__,&local_58,&local_d8);
          pdVar2 = this->m_P;
          sVar3 = this->m_P_stride;
          ON_3dPoint::ON_3dPoint
                    ((ON_3dPoint *)&local_70,(pdVar2[sVar3] + pdVar2[sVar3 * 3]) * 0.5,
                     (pdVar2[sVar3 + 1] + pdVar2[sVar3 * 3 + 1]) * 0.5,
                     (pdVar2[sVar3 + 2] + pdVar2[sVar3 * 3 + 2]) * 0.5);
          ON_3dPoint::operator-(&local_a0,(ON_3dPoint *)&local_70,&local_58);
          ON_3dVector::UnitVector(&local_88,&local_a0);
          d = ON_3dVector::operator*(&local_d8,&local_88);
          ::operator*(&local_40,d,&local_88);
          ON_3dVector::operator-(&local_b8,&local_88,&local_40);
          ON_3dVector::UnitVector(&local_a0,&local_b8);
          bVar5 = ON_3dVector::IsUnitVector(&local_a0);
          if (bVar5) {
            (__return_storage_ptr__->xaxis).z = local_a0.z;
            (__return_storage_ptr__->xaxis).x = local_a0.x;
            (__return_storage_ptr__->xaxis).y = local_a0.y;
            ON_CrossProduct(&local_b8,&local_d8,&local_a0);
            (__return_storage_ptr__->yaxis).z = local_b8.z;
            (__return_storage_ptr__->yaxis).x = local_b8.x;
            (__return_storage_ptr__->yaxis).y = local_b8.y;
          }
          if (bVar4) {
            return __return_storage_ptr__;
          }
        }
      }
    }
    else {
      P_dex = (bVar1 + 2) * (uint)bVar1 >> 1;
      ON_Plane::ON_Plane(__return_storage_ptr__);
      bVar4 = Internal_GetFrameHelper(this,P_dex,P_dex + 1,__return_storage_ptr__);
      if (bVar4) {
        return __return_storage_ptr__;
      }
      ON_Plane::~ON_Plane(__return_storage_ptr__);
    }
  }
  pOVar7 = &ON_Plane::NanPlane;
  pOVar8 = __return_storage_ptr__;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pOVar8->origin).x = (pOVar7->origin).x;
    pOVar7 = (ON_Plane *)((long)pOVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    pOVar8 = (ON_Plane *)((long)pOVar8 + (ulong)bVar9 * -0x10 + 8);
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDMeshFragment::CenterFrame() const
{
  if (false == HasValidPointAndNormalGrid() )
    return ON_Plane::NanPlane;

  if (1 == m_grid.m_side_segment_count)
  {
    const ON_3dPoint P(
      0.25*(m_P[0] + m_P[m_P_stride] + m_P[2 * m_P_stride] + m_P[3 * m_P_stride]),
      0.25*(m_P[1] + m_P[1 + m_P_stride] + m_P[1 + 2 * m_P_stride] + m_P[1 + 3 * m_P_stride]),
      0.25*(m_P[2] + m_P[2 + m_P_stride] + m_P[2 + 2 * m_P_stride] + m_P[2 + 3 * m_P_stride])
    );
    if( false == (P.x == P.x))
      return ON_Plane::NanPlane;
    ON_3dVector N = ON_3dVector(
      (m_N[0] + m_N[m_N_stride] + m_N[2 * m_N_stride] + m_N[3 * m_N_stride]),
      (m_N[1] + m_N[1 + m_N_stride] + m_N[1 + 2 * m_N_stride] + m_N[1 + 3 * m_N_stride]),
      (m_N[2] + m_N[2 + m_N_stride] + m_N[2 + 2 * m_N_stride] + m_N[2 + 3 * m_N_stride])
    ).UnitVector();
    if (false == N.IsUnitVector())
      N = ON_3dVector(m_N).UnitVector();
    if ( N.IsUnitVector() )
    {
      ON_Plane center_frame(P, N);
      const ON_3dPoint Q(
        0.5*(m_P[m_P_stride] + m_P[3 * m_P_stride]),
        0.5*(m_P[1 + m_P_stride] + m_P[1 + 3 * m_P_stride]),
        0.5*(m_P[2 + m_P_stride] + m_P[2 + 3 * m_P_stride])
      );
      const ON_3dVector V = (Q - P).UnitVector();
      const ON_3dVector X = (V - (N*V)*V).UnitVector();
      if (X.IsUnitVector())
      {
        center_frame.xaxis = X;
        center_frame.yaxis = ON_CrossProduct(N, X);
      }
      return center_frame;
    }
  }
  else
  {
    const unsigned int P_dex = (m_grid.m_side_segment_count*(m_grid.m_side_segment_count + 2)) / 2;
    ON_Plane center_frame;
    if (Internal_GetFrameHelper(P_dex, P_dex + 1, center_frame))
      return center_frame;
  }

  return ON_Plane::NanPlane;
}